

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_text.c
# Opt level: O0

log_policy_interface log_policy_format_text_interface(void)

{
  return &log_policy_format_text_interface::policy_interface_format;
}

Assistant:

log_policy_interface log_policy_format_text_interface(void)
{
	static struct log_policy_format_impl_type log_policy_format_text_impl_obj = {
		&log_policy_format_text_size,
		&log_policy_format_text_serialize,
		&log_policy_format_text_deserialize
	};

	static struct log_policy_interface_type policy_interface_format = {
		&log_policy_format_text_create,
		&log_policy_format_text_impl_obj,
		&log_policy_format_text_destroy
	};

	return &policy_interface_format;
}